

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cgi::connection::async_write(connection *this,const_buffer *buf,bool eof,handler *h)

{
  bool bVar1;
  ulong uVar2;
  callable<void_(const_std::error_code_&)> *p_00;
  callback *pcVar3;
  error_code *in_RCX;
  byte in_DL;
  undefined8 in_RSI;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *in_RDI;
  handler *in_stack_00000018;
  vector<char,_std::allocator<char>_> *in_stack_00000020;
  conn_type *in_stack_00000028;
  async_write_handler *in_stack_00000030;
  self_type p;
  error_code e;
  connection *in_stack_ffffffffffffff78;
  error_code *in_stack_ffffffffffffff80;
  undefined1 add_ref;
  error_code local_30;
  error_code *local_20;
  byte local_11;
  undefined8 local_10;
  
  local_11 = in_DL & 1;
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::error_code::error_code(in_stack_ffffffffffffff80);
  add_ref = (undefined1)((ulong)in_stack_ffffffffffffff80 >> 0x38);
  uVar2 = (*(code *)in_RDI->p_[2].super_refcounted._vptr_refcounted)
                    (in_RDI,local_10,local_11 & 1,&local_30);
  if (((uVar2 & 1) == 0) && (bVar1 = std::error_code::operator_cast_to_bool(&local_30), !bVar1)) {
    (**(code **)&in_RDI->p_[3].super_refcounted.refs_)();
    p_00 = (callable<void_(const_std::error_code_&)> *)operator_new(0x70);
    self(in_stack_ffffffffffffff78);
    async_write_handler::async_write_handler
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
              (in_RDI,p_00,(bool)add_ref);
    std::shared_ptr<cppcms::impl::cgi::connection>::~shared_ptr
              ((shared_ptr<cppcms::impl::cgi::connection> *)0x37ebf4);
    pcVar3 = (callback *)(*(code *)in_RDI->p_[7].super_refcounted._vptr_refcounted)();
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)pcVar3,
               (intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)
               in_stack_ffffffffffffff78);
    booster::callback<void(std::error_code_const&)>::
    callback<booster::callable<void(std::error_code_const&)>>
              ((callback<void_(const_std::error_code_&)> *)pcVar3,
               (intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)
               in_stack_ffffffffffffff78);
    booster::aio::basic_io_device::on_writeable(pcVar3);
    booster::callback<void_(const_std::error_code_&)>::~callback
              ((callback<void_(const_std::error_code_&)> *)0x37ec46);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)pcVar3);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)pcVar3);
    return;
  }
  pcVar3 = (callback *)(*(code *)in_RDI->p_[6].super_refcounted._vptr_refcounted)();
  booster::aio::io_service::post(pcVar3,local_20);
  return;
}

Assistant:

void connection::async_write(booster::aio::const_buffer const &buf,bool eof,handler const &h)
{
	booster::system::error_code e;
	if(nonblocking_write(buf,eof,e) || e) {
		get_io_service().post(h,e);
		return;
	}
	on_async_write_start();
	async_write_handler::self_type p(new async_write_handler(self(),pending_output_,h));
	socket().on_writeable(p);
}